

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PrintTo<phmap::priv::(anonymous_namespace)::NonMovableKey_const,int>
               (pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int> *value,
               ostream *os)

{
  ostream *os_local;
  pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int> *value_local;
  
  std::operator<<(os,'(');
  UniversalPrinter<phmap::priv::(anonymous_namespace)::NonMovableKey>::Print(&value->first,os);
  std::operator<<(os,", ");
  UniversalPrinter<int>::Print(&value->second,os);
  std::operator<<(os,')');
  return;
}

Assistant:

void PrintTo(const ::std::pair<T1, T2>& value, ::std::ostream* os) {
  *os << '(';
  // We cannot use UniversalPrint(value.first, os) here, as T1 may be
  // a reference type.  The same for printing value.second.
  UniversalPrinter<T1>::Print(value.first, os);
  *os << ", ";
  UniversalPrinter<T2>::Print(value.second, os);
  *os << ')';
}